

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GcodePovray.cpp
# Opt level: O1

ostream * operator<<(ostream *os,vector3 *vv)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"<",1);
  poVar1 = std::ostream::_M_insert<double>(vv->x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
  poVar1 = std::ostream::_M_insert<double>(vv->y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
  poVar1 = std::ostream::_M_insert<double>(vv->z);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"> ",2);
  return os;
}

Assistant:

ostream& operator<<(ostream& os, const vector3& vv)
{
  os << "<" << vv.x << "," << vv.y << "," << vv.z << "> ";
  return os;
}